

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall Network::Socket::BaseSocket::setError(BaseSocket *this,int errorCode)

{
  Error EVar1;
  Error *pEVar2;
  
  EVar1 = Success;
  if (errorCode != -1) goto LAB_001157bc;
  pEVar2 = __errno_location();
  EVar1 = *pEVar2;
  if (EVar1 < 0x62) {
    if (EVar1 == Success) goto LAB_001157bc;
    if (EVar1 == 0xb) {
LAB_0011580b:
      EVar1 = InProgress;
      goto LAB_001157bc;
    }
    if (EVar1 == 0x16) {
      EVar1 = BadArgument;
      goto LAB_001157bc;
    }
  }
  else if (EVar1 < 0x72) {
    if (EVar1 == 0x62) {
LAB_00115812:
      EVar1 = StillInUse;
      goto LAB_001157bc;
    }
    if (EVar1 == 0x6f) {
      EVar1 = Refused;
      goto LAB_001157bc;
    }
  }
  else {
    if (EVar1 == 0x72) goto LAB_00115812;
    if (EVar1 == 0x73) goto LAB_0011580b;
  }
  EVar1 = OtherError;
LAB_001157bc:
  this->lastError = EVar1;
  return errorCode;
}

Assistant:

int BaseSocket::setError(int errorCode) const
        {
            if (errorCode == -1)
            {
    #ifdef _WIN32
                switch (WSAGetLastError())
                {
                case 0: lastError = Success; return errorCode;
                case WSAEINPROGRESS:
                case WSAEWOULDBLOCK: lastError = InProgress; return errorCode;
                case WSAECONNREFUSED: lastError = Refused; return errorCode;
                case WSAEALREADY:
                case WSAEADDRINUSE: lastError = StillInUse; return errorCode;
                case WSAEINVAL: lastError = BadArgument; return errorCode;
                default: lastError = OtherError; return errorCode;
                }
    #else
                switch (errno)
                {
                case 0: lastError = Success; return errorCode;
                case EWOULDBLOCK:
                case EINPROGRESS: lastError = InProgress; return errorCode;
                case ECONNREFUSED: lastError = Refused; return errorCode;
                case EALREADY:
                case EADDRINUSE: lastError = StillInUse; return errorCode;
                case EINVAL: lastError = BadArgument; return errorCode;
                default: lastError = OtherError; return errorCode;
                }
    #endif
            }
            lastError = Success;
            return errorCode;
        }